

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsg_unittest.cc
# Opt level: O2

void __thiscall
StunMsg_RFC5769SampleIPv4Response_Test::TestBody(StunMsg_RFC5769SampleIPv4Response_Test *this)

{
  sockaddr_in *psVar1;
  uint16_t uVar2;
  int iVar3;
  stun_attr_varsize *attr;
  void *vec_a;
  stun_attr_xor_sockaddr *attr_00;
  stun_attr_msgint *msgint;
  stun_attr_hdr *psVar4;
  long lVar5;
  undefined8 *puVar6;
  uint8_t *puVar7;
  char *pcVar8;
  char *in_R9;
  AssertHelper local_158;
  AssertHelper local_150;
  AssertionResult gtest_ar_;
  sockaddr_in test_addr;
  char software_name [12];
  uint8_t tsx_id [12];
  char password [23];
  uint8_t expected_result [80];
  sockaddr_in ipv4;
  uint8_t buffer [80];
  
  builtin_strncpy(software_name,"test vector",0xc);
  builtin_strncpy(password,"VOkJxbRl1RmTxUk/WvJxBt",0x17);
  puVar6 = &DAT_00146940;
  puVar7 = expected_result;
  for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
    *(undefined8 *)puVar7 = *puVar6;
    puVar6 = puVar6 + 1;
    puVar7 = puVar7 + 8;
  }
  tsx_id[0] = 0xb7;
  tsx_id[1] = 0xe7;
  tsx_id[2] = 0xa7;
  tsx_id[3] = '\x01';
  tsx_id[4] = 0xbc;
  tsx_id[5] = '4';
  tsx_id[6] = 0xd6;
  tsx_id[7] = 0x86;
  tsx_id[8] = 0xfa;
  tsx_id[9] = 0x87;
  tsx_id[10] = 0xdf;
  tsx_id[0xb] = 0xae;
  ipv4.sin_family = 2;
  ipv4.sin_port = 0x5580;
  inet_pton(2,"192.0.2.1",&ipv4.sin_addr);
  gtest_ar_.success_ = true;
  gtest_ar_._1_7_ = 0;
  local_158.data_ = (AssertHelperData *)0x50;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&test_addr,"sizeof(expected_result)","sizeof(buffer)",
             (unsigned_long *)&gtest_ar_,(unsigned_long *)&local_158);
  if ((char)test_addr.sin_family == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (test_addr.sin_zero == (uchar  [8])0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)test_addr.sin_zero;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
               ,0x106,pcVar8);
    testing::internal::AssertHelper::operator=(&local_158,(Message *)&gtest_ar_);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)test_addr.sin_zero);
    gtest_ar_._0_4_ = 1;
    iVar3 = stun_msg_verify((stun_msg_hdr *)expected_result,0x50);
    local_158.data_._0_4_ = iVar3;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&test_addr,"1",
               "stun_msg_verify((stun_msg_hdr*)expected_result, sizeof(expected_result))",
               (int *)&gtest_ar_,(int *)&local_158);
    if ((char)test_addr.sin_family == '\0') {
      testing::Message::Message((Message *)&gtest_ar_);
      if (test_addr.sin_zero == (uchar  [8])0x0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = *(char **)test_addr.sin_zero;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_158,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                 ,0x108,pcVar8);
      testing::internal::AssertHelper::operator=(&local_158,(Message *)&gtest_ar_);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)test_addr.sin_zero);
      stun_msg_hdr_init((stun_msg_hdr *)buffer,0x101,tsx_id);
      stun_attr_varsize_add((stun_msg_hdr *)buffer,0x8022,software_name,0xb,' ');
      stun_attr_xor_sockaddr_add((stun_msg_hdr *)buffer,0x20,(sockaddr *)&ipv4);
      stun_attr_msgint_add((stun_msg_hdr *)buffer,password,0x16);
      stun_attr_fingerprint_add((stun_msg_hdr *)buffer);
      anon_unknown.dwarf_6ced::IsEqual
                ((anon_unknown_dwarf_6ced *)&gtest_ar_,expected_result,(stun_msg_hdr *)buffer,0x50);
      if (gtest_ar_.success_ == false) {
        testing::Message::Message((Message *)&local_158);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&test_addr,(internal *)&gtest_ar_,
                   (AssertionResult *)"IsEqual(expected_result, buffer, sizeof(expected_result))",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_150,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x113,(char *)test_addr._0_8_);
        testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_158);
        testing::internal::AssertHelper::~AssertHelper(&local_150);
        std::__cxx11::string::~string((string *)&test_addr);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_158);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar_.message_);
      gtest_ar_._0_4_ = 0x101;
      uVar2 = stun_msg_type((stun_msg_hdr *)expected_result);
      local_158.data_._0_2_ = uVar2;
      testing::internal::CmpHelperEQ<stun_msg_type,unsigned_short>
                ((internal *)&test_addr,"STUN_BINDING_RESPONSE","stun_msg_type(msg_hdr)",
                 (stun_msg_type *)&gtest_ar_,(unsigned_short *)&local_158);
      if ((char)test_addr.sin_family == '\0') {
        testing::Message::Message((Message *)&gtest_ar_);
        if (test_addr.sin_zero == (uchar  [8])0x0) {
          pcVar8 = "";
        }
        else {
          pcVar8 = *(char **)test_addr.sin_zero;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_158,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x117,pcVar8);
        testing::internal::AssertHelper::operator=(&local_158,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_158);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)test_addr.sin_zero);
      gtest_ar_.success_ = true;
      gtest_ar_._1_7_ = 0;
      local_158.data_ = (AssertHelperData *)stun_msg_len((stun_msg_hdr *)expected_result);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&test_addr,"sizeof(expected_result)","stun_msg_len(msg_hdr)",
                 (unsigned_long *)&gtest_ar_,(unsigned_long *)&local_158);
      if ((char)test_addr.sin_family == '\0') {
        testing::Message::Message((Message *)&gtest_ar_);
        if (test_addr.sin_zero == (uchar  [8])0x0) {
          pcVar8 = "";
        }
        else {
          pcVar8 = *(char **)test_addr.sin_zero;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_158,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x118,pcVar8);
        testing::internal::AssertHelper::operator=(&local_158,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_158);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)test_addr.sin_zero);
      attr = (stun_attr_varsize *)
             stun_msg_next_attr((stun_msg_hdr *)expected_result,(stun_attr_hdr *)0x0);
      gtest_ar_._0_4_ = 0x8022;
      uVar2 = stun_attr_type((stun_attr_hdr *)attr);
      local_158.data_._0_2_ = uVar2;
      testing::internal::CmpHelperEQ<stun_attr_type,unsigned_short>
                ((internal *)&test_addr,"STUN_ATTR_SOFTWARE","stun_attr_type(attr_hdr)",
                 (stun_attr_type *)&gtest_ar_,(unsigned_short *)&local_158);
      if ((char)test_addr.sin_family == '\0') {
        testing::Message::Message((Message *)&gtest_ar_);
        if (test_addr.sin_zero == (uchar  [8])0x0) {
          pcVar8 = "";
        }
        else {
          pcVar8 = *(char **)test_addr.sin_zero;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_158,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                   ,0x11b,pcVar8);
        testing::internal::AssertHelper::operator=(&local_158,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_158);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)test_addr.sin_zero);
      gtest_ar_.success_ = true;
      gtest_ar_._1_7_ = 0;
      local_158.data_ = (AssertHelperData *)stun_attr_len((stun_attr_hdr *)attr);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&test_addr,"sizeof(software_name)-1","stun_attr_len(attr_hdr)",
                 (unsigned_long *)&gtest_ar_,(unsigned_long *)&local_158);
      if ((char)test_addr.sin_family != '\0') {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)test_addr.sin_zero);
        vec_a = stun_attr_varsize_read(attr);
        anon_unknown.dwarf_6ced::IsEqual
                  ((anon_unknown_dwarf_6ced *)&gtest_ar_,vec_a,software_name,0xb);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&local_158);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&test_addr,(internal *)&gtest_ar_,
                     (AssertionResult *)"IsEqual(data, software_name, sizeof(software_name)-1)",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_150,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x11e,(char *)test_addr._0_8_);
          testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_158);
          testing::internal::AssertHelper::~AssertHelper(&local_150);
          std::__cxx11::string::~string((string *)&test_addr);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_158);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        attr_00 = (stun_attr_xor_sockaddr *)
                  stun_msg_next_attr((stun_msg_hdr *)expected_result,(stun_attr_hdr *)attr);
        gtest_ar_._0_4_ = 0x20;
        uVar2 = stun_attr_type((stun_attr_hdr *)attr_00);
        local_158.data_._0_2_ = uVar2;
        testing::internal::CmpHelperEQ<stun_attr_type,unsigned_short>
                  ((internal *)&test_addr,"STUN_ATTR_XOR_MAPPED_ADDRESS","stun_attr_type(attr_hdr)",
                   (stun_attr_type *)&gtest_ar_,(unsigned_short *)&local_158);
        if ((char)test_addr.sin_family == '\0') {
          testing::Message::Message((Message *)&gtest_ar_);
          if (test_addr.sin_zero == (uchar  [8])0x0) {
            pcVar8 = "";
          }
          else {
            pcVar8 = *(char **)test_addr.sin_zero;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_158,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x121,pcVar8);
          testing::internal::AssertHelper::operator=(&local_158,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper(&local_158);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar_);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)test_addr.sin_zero);
        test_addr.sin_family = 0;
        test_addr.sin_port = 0;
        test_addr.sin_addr.s_addr = 0;
        test_addr.sin_zero[0] = '\0';
        test_addr.sin_zero[1] = '\0';
        test_addr.sin_zero[2] = '\0';
        test_addr.sin_zero[3] = '\0';
        test_addr.sin_zero[4] = '\0';
        test_addr.sin_zero[5] = '\0';
        test_addr.sin_zero[6] = '\0';
        test_addr.sin_zero[7] = '\0';
        local_158.data_ = local_158.data_ & 0xffffffff00000000;
        local_150.data_._0_4_ =
             stun_attr_xor_sockaddr_read
                       (attr_00,(stun_msg_hdr *)expected_result,(sockaddr *)&test_addr);
        testing::internal::CmpHelperEQ<stun_status_type,int>
                  ((internal *)&gtest_ar_,"STUN_OK",
                   "stun_attr_xor_sockaddr_read( (stun_attr_sockaddr*)attr_hdr, msg_hdr, (sockaddr*)&test_addr)"
                   ,(stun_status_type *)&local_158,(int *)&local_150);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&local_158);
          if (gtest_ar_.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar8 = "";
          }
          else {
            pcVar8 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_150,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x125,pcVar8);
          testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_158);
          testing::internal::AssertHelper::~AssertHelper(&local_150);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_158);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        local_158.data_._0_4_ = 2;
        testing::internal::CmpHelperEQ<int,unsigned_short>
                  ((internal *)&gtest_ar_,"2","test_addr.sin_family",(int *)&local_158,
                   &test_addr.sin_family);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&local_158);
          if (gtest_ar_.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar8 = "";
          }
          else {
            pcVar8 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_150,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x126,pcVar8);
          testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_158);
          testing::internal::AssertHelper::~AssertHelper(&local_150);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_158);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        local_158.data_._0_2_ = 0x5580;
        testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
                  ((internal *)&gtest_ar_,"__bswap_16 (32853)","test_addr.sin_port",
                   (unsigned_short *)&local_158,&test_addr.sin_port);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&local_158);
          if (gtest_ar_.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar8 = "";
          }
          else {
            pcVar8 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_150,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x127,pcVar8);
          testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_158);
          testing::internal::AssertHelper::~AssertHelper(&local_150);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_158);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        local_158.data_ = local_158.data_ & 0xffffffff00000000;
        local_150.data_._0_4_ = memcmp(&test_addr.sin_addr,&ipv4.sin_addr,4);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar_,"0",
                   "memcmp(&test_addr.sin_addr, &ipv4.sin_addr, sizeof(ipv4.sin_addr))",
                   (int *)&local_158,(int *)&local_150);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&local_158);
          if (gtest_ar_.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar8 = "";
          }
          else {
            pcVar8 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_150,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x129,pcVar8);
          testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_158);
          testing::internal::AssertHelper::~AssertHelper(&local_150);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_158);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        msgint = (stun_attr_msgint *)
                 stun_msg_next_attr((stun_msg_hdr *)expected_result,(stun_attr_hdr *)attr_00);
        local_158.data_._0_4_ = 8;
        uVar2 = stun_attr_type((stun_attr_hdr *)msgint);
        local_150.data_._0_4_ = CONCAT22(local_150.data_._2_2_,uVar2);
        testing::internal::CmpHelperEQ<stun_attr_type,unsigned_short>
                  ((internal *)&gtest_ar_,"STUN_ATTR_MESSAGE_INTEGRITY","stun_attr_type(attr_hdr)",
                   (stun_attr_type *)&local_158,(unsigned_short *)&local_150);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&local_158);
          if (gtest_ar_.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar8 = "";
          }
          else {
            pcVar8 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_150,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,300,pcVar8);
          testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_158);
          testing::internal::AssertHelper::~AssertHelper(&local_150);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_158);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        local_158.data_._0_4_ = 1;
        local_150.data_._0_4_ =
             stun_attr_msgint_check(msgint,(stun_msg_hdr *)expected_result,(uint8_t *)password,0x16)
        ;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar_,"1",
                   "stun_attr_msgint_check((stun_attr_msgint*)attr_hdr, msg_hdr, (uint8_t*)password, sizeof(password)-1)"
                   ,(int *)&local_158,(int *)&local_150);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&local_158);
          if (gtest_ar_.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar8 = "";
          }
          else {
            pcVar8 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_150,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x12e,pcVar8);
          testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_158);
          testing::internal::AssertHelper::~AssertHelper(&local_150);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_158);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        psVar4 = stun_msg_next_attr((stun_msg_hdr *)expected_result,(stun_attr_hdr *)msgint);
        local_158.data_._0_4_ = 0x8028;
        uVar2 = stun_attr_type(psVar4);
        local_150.data_._0_4_ = CONCAT22(local_150.data_._2_2_,uVar2);
        testing::internal::CmpHelperEQ<stun_attr_type,unsigned_short>
                  ((internal *)&gtest_ar_,"STUN_ATTR_FINGERPRINT","stun_attr_type(attr_hdr)",
                   (stun_attr_type *)&local_158,(unsigned_short *)&local_150);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&local_158);
          if (gtest_ar_.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar8 = "";
          }
          else {
            pcVar8 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_150,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x131,pcVar8);
          testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_158);
          testing::internal::AssertHelper::~AssertHelper(&local_150);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_158);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar_.message_);
        psVar4 = stun_msg_next_attr((stun_msg_hdr *)expected_result,psVar4);
        testing::internal::EqHelper<true>::Compare<_stun_attr_hdr_const>
                  ((EqHelper<true> *)&gtest_ar_,"__null","attr_hdr",(Secret *)0x0,psVar4);
        if (gtest_ar_.success_ == false) {
          testing::Message::Message((Message *)&local_158);
          if (gtest_ar_.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar8 = "";
          }
          else {
            pcVar8 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_150,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                     ,0x134,pcVar8);
          testing::internal::AssertHelper::operator=(&local_150,(Message *)&local_158);
          testing::internal::AssertHelper::~AssertHelper(&local_150);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_158);
        }
        psVar1 = (sockaddr_in *)&gtest_ar_;
        goto LAB_00126ef8;
      }
      testing::Message::Message((Message *)&gtest_ar_);
      if (test_addr.sin_zero == (uchar  [8])0x0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = *(char **)test_addr.sin_zero;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_158,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/balena[P]stun-msg/tests/stunmsg_unittest.cc"
                 ,0x11c,pcVar8);
      testing::internal::AssertHelper::operator=(&local_158,(Message *)&gtest_ar_);
    }
  }
  psVar1 = &test_addr;
  testing::internal::AssertHelper::~AssertHelper(&local_158);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar_);
LAB_00126ef8:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)psVar1->sin_zero);
  return;
}

Assistant:

TEST(StunMsg, RFC5769SampleIPv4Response) {
  const char software_name[] = "test vector";
  const char password[] = "VOkJxbRl1RmTxUk/WvJxBt";

  const uint8_t expected_result[] = {
    0x01,0x01,0x00,0x3c, //    Request type and message length
    0x21,0x12,0xa4,0x42, //    Magic cookie
    0xb7,0xe7,0xa7,0x01, // }
    0xbc,0x34,0xd6,0x86, // }  Transaction ID
    0xfa,0x87,0xdf,0xae, // }
    0x80,0x22,0x00,0x0b, //    SOFTWARE attribute header
    0x74,0x65,0x73,0x74, // }
    0x20,0x76,0x65,0x63, // }  UTF-8 server name
    0x74,0x6f,0x72,0x20, // }
    0x00,0x20,0x00,0x08, //    XOR-MAPPED-ADDRESS attribute header
    0x00,0x01,0xa1,0x47, //    Address family (IPv4) and xor'd mapped port number
    0xe1,0x12,0xa6,0x43, //    Xor'd mapped IPv4 address
    0x00,0x08,0x00,0x14, //    MESSAGE-INTEGRITY attribute header
    0x2b,0x91,0xf5,0x99, // }
    0xfd,0x9e,0x90,0xc3, // }
    0x8c,0x74,0x89,0xf9, // }  HMAC-SHA1 fingerprint
    0x2a,0xf9,0xba,0x53, // }
    0xf0,0x6b,0xe7,0xd7, // }
    0x80,0x28,0x00,0x04, //    FINGERPRINT attribute header
    0xc0,0x7d,0x4c,0x96, //    CRC32 fingerprint
  };

  uint8_t buffer[sizeof(stun_msg_hdr)
    + STUN_ATTR_VARSIZE_SIZE(sizeof(software_name)-1)
    + STUN_ATTR_SOCKADDR_SIZE(STUN_IPV4)
    + STUN_ATTR_MSGINT_SIZE
    + STUN_ATTR_UINT32_SIZE];

  stun_msg_hdr *msg_hdr = (stun_msg_hdr *)buffer;
  uint8_t tsx_id[12] = {
    0xb7,0xe7,0xa7,0x01,
    0xbc,0x34,0xd6,0x86,
    0xfa,0x87,0xdf,0xae
  };

  sockaddr_in ipv4;
  ipv4.sin_family = AF_INET;
  ipv4.sin_port = htons(32853);
  inet_pton(AF_INET, "192.0.2.1", &ipv4.sin_addr);

  ASSERT_EQ(sizeof(expected_result), sizeof(buffer));
  ASSERT_EQ(1, stun_msg_verify((stun_msg_hdr*)expected_result,
      sizeof(expected_result)));

  stun_msg_hdr_init(msg_hdr, STUN_BINDING_RESPONSE, tsx_id);
  stun_attr_varsize_add(msg_hdr, STUN_ATTR_SOFTWARE, software_name,
      sizeof(software_name)-1, ' ');
  stun_attr_xor_sockaddr_add(msg_hdr, STUN_ATTR_XOR_MAPPED_ADDRESS,
      (sockaddr*)&ipv4);
  stun_attr_msgint_add(msg_hdr, password, sizeof(password)-1);
  stun_attr_fingerprint_add(msg_hdr);

  EXPECT_TRUE(IsEqual(expected_result, buffer,
      sizeof(expected_result)));

  // Now decoding
  msg_hdr = (stun_msg_hdr *)expected_result;
  EXPECT_EQ(STUN_BINDING_RESPONSE, stun_msg_type(msg_hdr));
  EXPECT_EQ(sizeof(expected_result), stun_msg_len(msg_hdr));

  const stun_attr_hdr *attr_hdr = stun_msg_next_attr(msg_hdr, NULL);
  EXPECT_EQ(STUN_ATTR_SOFTWARE, stun_attr_type(attr_hdr));
  ASSERT_EQ(sizeof(software_name)-1, stun_attr_len(attr_hdr));
  const void* data = stun_attr_varsize_read((stun_attr_varsize*)attr_hdr);
  EXPECT_TRUE(IsEqual(data, software_name, sizeof(software_name)-1));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_XOR_MAPPED_ADDRESS, stun_attr_type(attr_hdr));
  sockaddr_in test_addr;
  memset(&test_addr, 0, sizeof(test_addr));
  EXPECT_EQ(STUN_OK, stun_attr_xor_sockaddr_read(
      (stun_attr_sockaddr*)attr_hdr, msg_hdr, (sockaddr*)&test_addr));
  EXPECT_EQ(AF_INET, test_addr.sin_family);
  EXPECT_EQ(htons(32853), test_addr.sin_port);
  EXPECT_EQ(0, memcmp(&test_addr.sin_addr, &ipv4.sin_addr,
      sizeof(ipv4.sin_addr)));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_MESSAGE_INTEGRITY, stun_attr_type(attr_hdr));
  EXPECT_EQ(1, stun_attr_msgint_check((stun_attr_msgint*)attr_hdr, msg_hdr,
      (uint8_t*)password, sizeof(password)-1));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(STUN_ATTR_FINGERPRINT, stun_attr_type(attr_hdr));

  attr_hdr = stun_msg_next_attr(msg_hdr, attr_hdr);
  EXPECT_EQ(NULL, attr_hdr);
}